

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O3

void __thiscall cppcms::http::impl::file_buffer::~file_buffer(file_buffer *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__file_buffer_002863b0;
  if ((FILE *)this->f_ != (FILE *)0x0) {
    fclose((FILE *)this->f_);
  }
  pcVar1 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->temp_dir_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->temp_dir_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar2 = (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  *(code **)this = booster::locale::ios_info::domain_id;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

~file_buffer()
	{
		if(f_)
			fclose(f_);
	}